

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

bool __thiscall miniply::PLYReader::which_property_type(PLYReader *this,PLYPropertyType *type)

{
  char *kw;
  long lVar1;
  bool bVar2;
  undefined1 *puVar3;
  long lVar4;
  
  bVar2 = keyword(this,"char");
  if (bVar2) {
    puVar3 = kTypeAliases;
    bVar2 = true;
  }
  else {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      kw = *(char **)(kTypeAliases + lVar4 + 0x10);
      if (lVar4 + 0x10 == 0x100) {
        return kw != (char *)0x0;
      }
      bVar2 = keyword(this,kw);
      lVar1 = lVar4 + 0x10;
    } while (!bVar2);
    bVar2 = kw != (char *)0x0;
    puVar3 = (undefined1 *)(lVar4 + 0x10ccb0);
  }
  *type = *(PLYPropertyType *)(puVar3 + 8);
  return bVar2;
}

Assistant:

bool PLYReader::which_property_type(PLYPropertyType* type)
  {
    for (uint32_t i = 0; kTypeAliases[i].name != nullptr; i++) {
      if (keyword(kTypeAliases[i].name)) {
        *type = kTypeAliases[i].type;
        return true;
      }
    }
    return false;
  }